

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool duckdb::AddPropagateStatistics::Operation<int,duckdb::TryAddOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long value;
  long value_00;
  Value local_70;
  
  iVar1 = NumericStats::GetMin<int>(lstats);
  iVar2 = NumericStats::GetMin<int>(rstats);
  value = (long)iVar2 + (long)iVar1;
  bVar3 = true;
  if ((int)value == value) {
    iVar1 = NumericStats::GetMax<int>(lstats);
    iVar2 = NumericStats::GetMax<int>(rstats);
    value_00 = (long)iVar2 + (long)iVar1;
    if ((int)value_00 == value_00) {
      Value::Numeric(&local_70,type,value);
      Value::operator=(new_min,&local_70);
      Value::~Value(&local_70);
      Value::Numeric(&local_70,type,value_00);
      Value::operator=(new_max,&local_70);
      Value::~Value(&local_70);
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		// new min is min+min
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMin<T>(rstats), min)) {
			return true;
		}
		// new max is max+max
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMax<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}